

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CartesianProductTest.cpp
# Opt level: O0

void __thiscall CardProdDiff::test_method(CardProdDiff *this)

{
  undefined8 uVar1;
  bool bVar2;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar3;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar4;
  lazy_ostream *prev;
  basic_cstring<const_char> local_738;
  basic_cstring<const_char> local_728;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_718;
  double local_6f8;
  assertion_result local_6f0;
  basic_cstring<const_char> local_6d8;
  basic_cstring<const_char> local_6c8;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_6b8;
  Matrix<double,__1,__1,_0,__1,__1> local_690;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_678;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_650;
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> local_628 [24];
  Scalar local_610;
  Scalar local_608;
  Scalar local_600;
  Scalar local_5f8;
  Scalar local_5f0;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_5e8;
  int local_5c4;
  undefined1 local_5c0 [8];
  VectorXd v;
  EigenBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
  local_488 [24];
  undefined1 local_470 [8];
  VectorXd x;
  Scalar local_458;
  Scalar local_450;
  Scalar local_448;
  Scalar local_440;
  Scalar local_438;
  Scalar local_430;
  Scalar local_428;
  Scalar local_420;
  Scalar local_418;
  Scalar local_410;
  Scalar local_408;
  Scalar local_400;
  Scalar local_3f8;
  Scalar local_3f0;
  Scalar local_3e8;
  Scalar local_3e0;
  Scalar local_3d8;
  Scalar local_3d0;
  Scalar local_3c8;
  Scalar local_3c0;
  Scalar local_3b8;
  Scalar local_3b0;
  Scalar local_3a8;
  Scalar local_3a0;
  Scalar local_398;
  Scalar local_390;
  Scalar local_388;
  Scalar local_380;
  Scalar local_378;
  Scalar local_370;
  Scalar local_368;
  Scalar local_360;
  Scalar local_358;
  Scalar local_350;
  Scalar local_348;
  Scalar local_340;
  Scalar local_338;
  Scalar local_330;
  Scalar local_328;
  Scalar local_320;
  Scalar local_318;
  Scalar local_310;
  Scalar local_308;
  Scalar local_300;
  Scalar local_2f8;
  Scalar local_2f0;
  Scalar local_2e8;
  Scalar local_2e0;
  Scalar local_2d8;
  Scalar local_2d0;
  Scalar local_2c8;
  Scalar local_2c0;
  Scalar local_2b8;
  Scalar local_2b0;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_2a8;
  int local_288 [2];
  undefined1 local_280 [8];
  MatrixXd Jtest;
  MatrixXd J;
  CartesianProduct S;
  undefined1 local_1b0 [8];
  SO3<mnf::ExpMapMatrix> RotSpace;
  RealSpace local_100 [8];
  RealSpace R3;
  RealSpace local_88 [8];
  RealSpace R2;
  CardProdDiff *this_local;
  
  mnf::RealSpace::RealSpace(local_88,2);
  mnf::RealSpace::RealSpace(local_100,3);
  mnf::SO3<mnf::ExpMapMatrix>::SO3((SO3<mnf::ExpMapMatrix> *)local_1b0);
  mnf::CartesianProduct::CartesianProduct
            ((CartesianProduct *)
             &J.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
             (Manifold *)local_88,(Manifold *)local_1b0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)
             &Jtest.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols);
  local_288[1] = 0xb;
  local_288[0] = 5;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_280,local_288 + 1,local_288);
  local_2b0 = 1.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator<<
            (&local_2a8,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_280,&local_2b0
            );
  local_2b8 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (&local_2a8,&local_2b8);
  local_2c0 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_2c0);
  local_2c8 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_2c8);
  local_2d0 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_2d0);
  local_2d8 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_2d8);
  local_2e0 = 1.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_2e0);
  local_2e8 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_2e8);
  local_2f0 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_2f0);
  local_2f8 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_2f8);
  local_300 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_300);
  local_308 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_308);
  local_310 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_310);
  local_318 = -0.573417053935868;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_318);
  local_320 = -0.109861317404411;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_320);
  local_328 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_328);
  local_330 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_330);
  local_338 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_338);
  local_340 = 0.249497069246539;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_340);
  local_348 = 0.920480138494529;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_348);
  local_350 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_350);
  local_358 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_358);
  local_360 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_360);
  local_368 = -0.780348700705586;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_368);
  local_370 = 0.375029072973363;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_370);
  local_378 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_378);
  local_380 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_380);
  local_388 = 0.573417053935868;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_388);
  local_390 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_390);
  local_398 = -0.811864134688605;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_398);
  local_3a0 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_3a0);
  local_3a8 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_3a8);
  local_3b0 = -0.249497069246539;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_3b0);
  local_3b8 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_3b8);
  local_3c0 = -0.300778202459022;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_3c0);
  local_3c8 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_3c8);
  local_3d0 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_3d0);
  local_3d8 = 0.780348700705586;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_3d8);
  local_3e0 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_3e0);
  local_3e8 = 0.500408932506048;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_3e8);
  local_3f0 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_3f0);
  local_3f8 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_3f8);
  local_400 = 0.109861317404411;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_400);
  local_408 = 0.811864134688605;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_408);
  local_410 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_410);
  local_418 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_418);
  local_420 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_420);
  local_428 = -0.920480138494529;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_428);
  local_430 = 0.300778202459022;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_430);
  local_438 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_438);
  local_440 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_440);
  local_448 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_448);
  local_450 = -0.375029072973363;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_450);
  local_458 = -0.500408932506048;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_458);
  x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
            (pCVar3,(Scalar *)
                    &x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer(&local_2a8);
  mnf::Manifold::getZero();
  mnf::SubPoint::value();
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
            ((Matrix<double,_1,1,0,_1,1> *)local_470,local_488);
  mnf::Point::~Point((Point *)&v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                               m_storage.m_rows);
  local_5c4 = 5;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_5c0,&local_5c4);
  local_5f0 = 243.27432598;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
            (&local_5e8,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_5c0,&local_5f0);
  local_5f8 = -2314327.23748;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (&local_5e8,&local_5f8);
  local_600 = 0.3403857;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar4,&local_600);
  local_608 = 0.58526775;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar4,&local_608);
  local_610 = 0.223811;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar4,&local_610);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_5e8);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            (local_628,(PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_470,
             (type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_650,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_470,(type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_678,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_5c0,(type *)0x0);
  mnf::Manifold::retractation
            (&J.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
             local_628,&local_650,&local_678);
  Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
            (&local_678);
  Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
            (&local_650);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_6b8,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_470,(type *)0x0);
  mnf::Manifold::diffRetractation((Ref_conflict *)&local_690);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=
            ((Matrix<double,__1,__1,_0,__1,__1> *)
             &Jtest.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols,&local_690);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_690);
  Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
            (&local_6b8);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6c8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
               ,0x75);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_6d8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_6c8,0x157,&local_6d8);
    local_6f8 = Eigen::NumTraits<double>::dummy_precision();
    bVar2 = Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
            isApprox<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                      ((DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
                       &Jtest.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_cols,
                       (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_280,&local_6f8)
    ;
    boost::test_tools::assertion_result::assertion_result(&local_6f0,bVar2);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_728,"J.isApprox(Jtest)",0x11);
    boost::unit_test::operator<<(&local_718,prev,&local_728);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_738,
               "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
               ,0x75);
    boost::test_tools::tt_detail::report_assertion(&local_6f0,&local_718,&local_738,0x157,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_718);
    boost::test_tools::assertion_result::~assertion_result(&local_6f0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_5c0);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_470);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_280);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)
             &Jtest.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols);
  mnf::CartesianProduct::~CartesianProduct
            ((CartesianProduct *)
             &J.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  mnf::SO3<mnf::ExpMapMatrix>::~SO3((SO3<mnf::ExpMapMatrix> *)local_1b0);
  mnf::RealSpace::~RealSpace(local_100);
  mnf::RealSpace::~RealSpace(local_88);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(CardProdDiff)
{
  RealSpace R2(2);
  RealSpace R3(3);
  SO3<ExpMapMatrix> RotSpace;
  CartesianProduct S(R2, RotSpace);
  Eigen::MatrixXd J;
  Eigen::MatrixXd Jtest(11, 5);
  Jtest << 1, 0, 0, 0, 0, 0, 1, 0, 0, 0, 0, 0, 0, -0.573417053935868,
      -0.109861317404411, 0, 0, 0, 0.249497069246539, 0.920480138494529, 0, 0,
      0, -0.780348700705586, 0.375029072973363, 0, 0, 0.573417053935868, 0,
      -0.811864134688605, 0, 0, -0.249497069246539, 0, -0.300778202459022, 0, 0,
      0.780348700705586, 0, 0.500408932506048, 0, 0, 0.109861317404411,
      0.811864134688605, 0, 0, 0, -0.920480138494529, 0.300778202459022, 0, 0,
      0, -0.375029072973363, -0.500408932506048, 0;
  Eigen::VectorXd x = S.getZero().value();
  Eigen::VectorXd v(5);
  v << 243.27432598, -2314327.23748, 0.3403857, 0.58526775, 0.223811;
  S.retractation(x, x, v);
  J = S.diffRetractation(x);
  BOOST_CHECK(J.isApprox(Jtest));
}